

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

void __thiscall
EnvironmentROBARM::PrintState(EnvironmentROBARM *this,int stateID,bool bVerbose,FILE *fOut)

{
  reference ppEVar1;
  long in_RCX;
  byte in_DL;
  int in_ESI;
  long *in_RDI;
  bool bGoal;
  EnvROBARMHashEntry_t *HashEntry;
  bool local_21;
  long local_18;
  
  local_18 = in_RCX;
  if (in_RCX == 0) {
    local_18 = _stdout;
  }
  ppEVar1 = std::vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>::operator[]
                      ((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)
                       (in_RDI + 0x2a),(long)in_ESI);
  local_21 = in_ESI == *(int *)in_RDI[0x26];
  if ((in_ESI == *(int *)in_RDI[0x26]) && ((in_DL & 1) != 0)) {
    local_21 = true;
  }
  (**(code **)(*in_RDI + 0x130))(in_RDI,local_18,(*ppEVar1)->coord,local_21,in_DL & 1,0);
  return;
}

Assistant:

void EnvironmentROBARM::PrintState(int stateID, bool bVerbose, FILE* fOut /*=NULL*/)
{

#if DEBUG
    if(stateID >= (int)EnvROBARM.StateID2CoordTable.size())
    {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal (2)");
    }
#endif

    if (fOut == NULL) fOut = stdout;

    EnvROBARMHashEntry_t* HashEntry = EnvROBARM.StateID2CoordTable[stateID];

    bool bGoal = false;
    if (stateID == EnvROBARM.goalHashEntry->stateID) bGoal = true;

    if (stateID == EnvROBARM.goalHashEntry->stateID && bVerbose) {
        SBPL_FPRINTF(fOut, "the state is a goal state\n");
        bGoal = true;
    }

    printangles(fOut, HashEntry->coord, bGoal, bVerbose, false);
}